

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_New_Library(FT_Memory memory,FT_Library *alibrary)

{
  FT_Memory pFVar1;
  int local_2c [2];
  FT_Error error;
  FT_Library library;
  FT_Library *alibrary_local;
  FT_Memory memory_local;
  
  stack0xffffffffffffffd8 = 0;
  if ((memory == (FT_Memory)0x0) || (alibrary == (FT_Library *)0x0)) {
    memory_local._4_4_ = 6;
  }
  else {
    library = (FT_Library)alibrary;
    alibrary_local = (FT_Library *)memory;
    pFVar1 = (FT_Memory)ft_mem_alloc(memory,400,local_2c);
    if (local_2c[0] == 0) {
      pFVar1->user = alibrary_local;
      *(undefined4 *)&pFVar1->alloc = 2;
      *(undefined4 *)((long)&pFVar1->alloc + 4) = 0xd;
      *(undefined4 *)&pFVar1->free = 0;
      *(undefined4 *)&pFVar1[0xc].alloc = 1;
      library->memory = pFVar1;
      memory_local._4_4_ = 0;
    }
    else {
      memory_local._4_4_ = local_2c[0];
    }
  }
  return memory_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Library( FT_Memory    memory,
                  FT_Library  *alibrary )
  {
    FT_Library  library = NULL;
    FT_Error    error;


    if ( !memory || !alibrary )
      return FT_THROW( Invalid_Argument );

#ifndef FT_DEBUG_LOGGING
#ifdef FT_DEBUG_LEVEL_ERROR
    /* init debugging support */
    ft_debug_init();
#endif /* FT_DEBUG_LEVEL_ERROR */
#endif /* !FT_DEBUG_LOGGING */

    /* first of all, allocate the library object */
    if ( FT_NEW( library ) )
      return error;

    library->memory = memory;

    library->version_major = FREETYPE_MAJOR;
    library->version_minor = FREETYPE_MINOR;
    library->version_patch = FREETYPE_PATCH;

    library->refcount = 1;

    /* That's ok now */
    *alibrary = library;

    return FT_Err_Ok;
  }